

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall luna::State::EraseMetatable(State *this,char *metatable_name)

{
  State *in_RSI;
  Table *metatables;
  Value nil;
  Value k;
  char *in_stack_ffffffffffffffc8;
  anon_union_8_9_8deb4486_for_Value_0 in_stack_ffffffffffffffd0;
  anon_union_8_9_8deb4486_for_Value_0 local_20;
  undefined4 local_18;
  
  Value::Value((Value *)&local_20);
  local_18 = 4;
  local_20.obj_ =
       &GetString(in_stack_ffffffffffffffd0.obj_,in_stack_ffffffffffffffc8)->super_GCObject;
  Value::Value((Value *)&stack0xffffffffffffffd0);
  GetMetatables(in_RSI);
  Table::SetValue((Table *)this,(Value *)metatable_name,(Value *)k._8_8_);
  return;
}

Assistant:

void State::EraseMetatable(const char *metatable_name)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(metatable_name);

        Value nil;
        auto metatables = GetMetatables();
        metatables->SetValue(k, nil);
    }